

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O3

void __thiscall
MaterialSystemTest_testMaterialNameAccess_Test::~MaterialSystemTest_testMaterialNameAccess_Test
          (MaterialSystemTest_testMaterialNameAccess_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testMaterialNameAccess) {
    aiMaterial *mat = new aiMaterial();
    EXPECT_NE(nullptr, mat);

    aiString name = mat->GetName();
    const int retValue(strncmp(name.C_Str(), AI_DEFAULT_MATERIAL_NAME, name.length));
    EXPECT_EQ(0, retValue );

    delete mat;
}